

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.hpp
# Opt level: O2

void __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::iSWAP(iSWAP<std::complex<double>_> *this,int *qubits)

{
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004d0c20;
  setQubits(this,qubits);
  return;
}

Assistant:

iSWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }